

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O3

Am_Value same_as_procedure(Am_Object *self)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar4;
  Am_Object *in_RSI;
  Am_Value AVar5;
  long *plVar3;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  iVar2 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  in_value = Am_Object::Get(in_RSI,*(Am_Slot_Key *)((long)plVar3 + 0xc),0);
  Am_Value::operator=((Am_Value *)self,in_value);
  plVar1 = plVar3 + 1;
  *(int *)plVar1 = (int)*plVar1 + -1;
  aVar4 = extraout_RDX;
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar3 + 0x20))(plVar3);
    aVar4 = extraout_RDX_00;
  }
  AVar5.value.wrapper_value = aVar4.wrapper_value;
  AVar5._0_8_ = self;
  return AVar5;
}

Assistant:

static Am_Value
same_as_procedure(Am_Object &self)
{
  Am_Value value;
  Key_Store_Data *store =
      (Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = self.Get(store->key);
  store->Release();
  return value;
}